

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerConfig.cpp
# Opt level: O3

RayTracerConfig * RayTracerConfig::fromFile(RayTracerConfig *__return_storage_ptr__,string *path)

{
  pointer *ppPVar1;
  char *pcVar2;
  pointer *ppSVar3;
  iterator __position;
  iterator __position_00;
  undefined4 uVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  istream *piVar8;
  invalid_argument *piVar9;
  long *plVar10;
  long *plVar11;
  size_type *psVar12;
  RayTracerConfig *pRVar13;
  long local_348;
  ifstream file;
  int aiStack_328 [122];
  float *local_140;
  RayTracerConfig *local_138;
  RayTracerConfig *local_130;
  RayTracerConfig *local_128;
  RayTracerConfig *local_120;
  Point *local_118;
  float *local_110;
  float *local_108;
  Point *local_100;
  float *local_f8;
  float *local_f0;
  vector<Plane,_std::allocator<Plane>_> *local_e8;
  vector<Sphere,_std::allocator<Sphere>_> *local_e0;
  undefined1 local_d8 [8];
  string token;
  long local_a8;
  long lStack_a0;
  undefined1 auStack_98 [8];
  Sphere sphere;
  undefined1 local_78 [8];
  string token_1;
  Plane plane;
  
  std::ifstream::ifstream((istream *)&local_348,(string *)path,_S_in);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&token_1.field_2 + 8),"Unable to open file: ",path);
    std::invalid_argument::invalid_argument(piVar9,(string *)(token_1.field_2._M_local_buf + 8));
    __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  (__return_storage_ptr__->super_BaseConfig).antiAliasing = 2;
  (__return_storage_ptr__->super_BaseConfig).maxRecursionLevel = 1;
  local_138 = (RayTracerConfig *)&(__return_storage_ptr__->super_BaseConfig).maxRecursionLevel;
  local_140 = &(__return_storage_ptr__->super_BaseConfig).ambientCoefficient;
  (__return_storage_ptr__->super_BaseConfig).ambientCoefficient = 0.1;
  (__return_storage_ptr__->super_BaseConfig).background.r = '\0';
  (__return_storage_ptr__->super_BaseConfig).background.g = '\0';
  (__return_storage_ptr__->super_BaseConfig).background.b = '\0';
  local_e0 = &__return_storage_ptr__->spheres;
  (__return_storage_ptr__->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = (undefined1  [8])&token._M_string_length;
  token._M_dataplus._M_p = (pointer)0x0;
  token._M_string_length._0_1_ = 0;
  local_e8 = &__return_storage_ptr__->planes;
  local_100 = &(__return_storage_ptr__->super_BaseConfig).light;
  local_f8 = &(__return_storage_ptr__->super_BaseConfig).light.y;
  local_f0 = &(__return_storage_ptr__->super_BaseConfig).light.z;
  local_118 = &(__return_storage_ptr__->super_BaseConfig).observer;
  local_110 = &(__return_storage_ptr__->super_BaseConfig).observer.y;
  local_108 = &(__return_storage_ptr__->super_BaseConfig).observer.z;
  local_120 = (RayTracerConfig *)&(__return_storage_ptr__->super_BaseConfig).imageZ;
  local_128 = (RayTracerConfig *)&(__return_storage_ptr__->super_BaseConfig).imageY;
  local_130 = (RayTracerConfig *)&(__return_storage_ptr__->super_BaseConfig).imageX;
  do {
    piVar8 = std::operator>>((istream *)&local_348,(string *)local_d8);
    if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
      if (local_d8 != (undefined1  [8])&token._M_string_length) {
        operator_delete((void *)local_d8,
                        CONCAT71(token._M_string_length._1_7_,(undefined1)token._M_string_length) +
                        1);
      }
      std::ifstream::~ifstream(&local_348);
      return __return_storage_ptr__;
    }
    cVar5 = (char)(istream *)&local_348;
    if (*(char *)local_d8 == '#') {
      cVar5 = std::ios::widen((char)*(undefined8 *)(local_348 + -0x18) + cVar5);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&local_348,(string *)local_d8,cVar5);
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)local_d8);
      pRVar13 = __return_storage_ptr__;
      if (iVar7 != 0) {
        iVar7 = std::__cxx11::string::compare((char *)local_d8);
        piVar8 = (istream *)&local_348;
        if (iVar7 == 0) {
LAB_00107e48:
          std::istream::_M_extract<float>((float *)piVar8);
          goto LAB_00107e4d;
        }
        iVar7 = std::__cxx11::string::compare((char *)local_d8);
        pRVar13 = local_138;
        if (iVar7 != 0) {
          iVar7 = std::__cxx11::string::compare((char *)local_d8);
          pRVar13 = local_130;
          if (iVar7 != 0) {
            iVar7 = std::__cxx11::string::compare((char *)local_d8);
            pRVar13 = local_128;
            if (iVar7 != 0) {
              iVar7 = std::__cxx11::string::compare((char *)local_d8);
              pRVar13 = local_120;
              if (iVar7 != 0) {
                iVar7 = std::__cxx11::string::compare((char *)local_d8);
                if (iVar7 == 0) {
                  piVar8 = std::istream::_M_extract<float>((float *)&local_348);
                  piVar8 = std::istream::_M_extract<float>((float *)piVar8);
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)local_d8);
                  if (iVar7 != 0) {
                    iVar7 = std::__cxx11::string::compare((char *)local_d8);
                    if (iVar7 == 0) {
                      sphere.radius = 0.0;
                      auStack_98 = (undefined1  [8])0x0;
                      sphere.center._0_7_ = 0;
                      sphere.center._7_4_ = 0;
                      token_1.field_2._8_8_ = &plane.P.z;
                      plane.P.x = 0.0;
                      plane.P.y = 0.0;
                      plane._8_8_ = plane._8_8_ & 0xffffffffffffff00;
                      while( true ) {
                        piVar8 = std::operator>>((istream *)&local_348,
                                                 (string *)(token_1.field_2._M_local_buf + 8));
                        if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0)
                        break;
                        if (*(char *)token_1.field_2._8_8_ == '#') {
                          cVar6 = std::ios::widen((char)*(undefined8 *)(local_348 + -0x18) + cVar5);
                          std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)&local_348,
                                     (string *)(token_1.field_2._M_local_buf + 8),cVar6);
                        }
                        else {
                          iVar7 = std::__cxx11::string::compare(token_1.field_2._M_local_buf + 8);
                          if (iVar7 == 0) break;
                          pcVar2 = token_1.field_2._M_local_buf + 8;
                          iVar7 = std::__cxx11::string::compare(pcVar2);
                          if (iVar7 == 0) {
                            piVar8 = std::istream::_M_extract<float>((float *)&local_348);
                            piVar8 = std::istream::_M_extract<float>((float *)piVar8);
                          }
                          else {
                            iVar7 = std::__cxx11::string::compare(pcVar2);
                            piVar8 = (istream *)&local_348;
                            if (iVar7 != 0) {
                              iVar7 = std::__cxx11::string::compare(pcVar2);
                              if (iVar7 == 0) {
                                anon_unknown.dwarf_25f6c::operator>>
                                          ((istream *)&local_348,(RGB *)&sphere.center.z);
                                goto LAB_00107f9c;
                              }
                              iVar7 = std::__cxx11::string::compare(pcVar2);
                              if (iVar7 != 0) {
                                piVar9 = (invalid_argument *)
                                         __cxa_allocate_exception(0x10,&sphere.radius);
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)((long)&token.field_2 + 8),"Unknown token \'",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)((long)&token_1.field_2 + 8));
                                plVar10 = (long *)std::__cxx11::string::append
                                                            (token.field_2._M_local_buf + 8);
                                local_78 = (undefined1  [8])*plVar10;
                                psVar12 = (size_type *)(plVar10 + 2);
                                if (local_78 == (undefined1  [8])psVar12) {
                                  token_1._M_string_length = *psVar12;
                                  token_1.field_2._M_allocated_capacity = plVar10[3];
                                  local_78 = (undefined1  [8])&token_1._M_string_length;
                                }
                                else {
                                  token_1._M_string_length = *psVar12;
                                }
                                token_1._M_dataplus._M_p = (pointer)plVar10[1];
                                *plVar10 = (long)psVar12;
                                plVar10[1] = 0;
                                *(undefined1 *)(plVar10 + 2) = 0;
                                std::invalid_argument::invalid_argument(piVar9,(string *)local_78);
                                __cxa_throw(piVar9,&std::invalid_argument::typeinfo,
                                            std::invalid_argument::~invalid_argument);
                              }
                            }
                          }
                          std::istream::_M_extract<float>((float *)piVar8);
                        }
LAB_00107f9c:
                        if (*(int *)((long)aiStack_328 + *(long *)(local_348 + -0x18)) != 0) {
                          piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
                          std::invalid_argument::invalid_argument
                                    (piVar9,"Invalid config file format.");
                          __cxa_throw(piVar9,&std::invalid_argument::typeinfo,
                                      std::invalid_argument::~invalid_argument);
                        }
                      }
                      if ((float *)token_1.field_2._8_8_ != &plane.P.z) {
                        operator_delete((void *)token_1.field_2._8_8_,plane._8_8_ + 1);
                      }
                      uVar4 = sphere.center._7_4_;
                      __position_00._M_current =
                           (__return_storage_ptr__->spheres).
                           super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (__position_00._M_current ==
                          (__return_storage_ptr__->spheres).
                          super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<Sphere,_std::allocator<Sphere>_>::_M_realloc_insert<Sphere>
                                  (local_e0,__position_00,(Sphere *)auStack_98);
                      }
                      else {
                        ((__position_00._M_current)->color).r = sphere.center.z._0_1_;
                        ((__position_00._M_current)->color).g = sphere.center.z._1_1_;
                        ((__position_00._M_current)->color).b = sphere.center.z._2_1_;
                        (__position_00._M_current)->field_0x13 = sphere.center.z._3_1_;
                        (__position_00._M_current)->reflectionCoefficient = sphere.radius;
                        sphere.center.y._3_1_ = (undefined1)uVar4;
                        ((__position_00._M_current)->center).x = (float)auStack_98._0_4_;
                        ((__position_00._M_current)->center).y = (float)auStack_98._4_4_;
                        *(ulong *)&((__position_00._M_current)->center).z =
                             CONCAT17(sphere.center.y._3_1_,sphere.center._0_7_);
                        ppSVar3 = &(__return_storage_ptr__->spheres).
                                   super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                                   super__Vector_impl_data._M_finish;
                        *ppSVar3 = *ppSVar3 + 1;
                        sphere.center._7_4_ = uVar4;
                      }
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare((char *)local_d8);
                      if (iVar7 != 0) {
                        piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_78,"Unknown token \'",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_d8);
                        plVar10 = (long *)std::__cxx11::string::append(local_78);
                        token_1.field_2._8_8_ = *plVar10;
                        plVar11 = plVar10 + 2;
                        if ((long *)token_1.field_2._8_8_ == plVar11) {
                          plane._8_8_ = *plVar11;
                          plane.normal._4_8_ = plVar10[3];
                          token_1.field_2._8_8_ = &plane.P.z;
                        }
                        else {
                          plane._8_8_ = *plVar11;
                        }
                        plane.P._0_8_ = plVar10[1];
                        *plVar10 = (long)plVar11;
                        plVar10[1] = 0;
                        *(undefined1 *)(plVar10 + 2) = 0;
                        std::invalid_argument::invalid_argument
                                  (piVar9,(string *)(token_1.field_2._M_local_buf + 8));
                        __cxa_throw(piVar9,&std::invalid_argument::typeinfo,
                                    std::invalid_argument::~invalid_argument);
                      }
                      plane.P.z = 0.0;
                      plane.normal.x = 0.0;
                      plane.normal.y = 0.0;
                      plane.normal.z = 0.0;
                      token_1.field_2._8_8_ = 0;
                      plane.P.x = 0.0;
                      plane.P.y = 0.0;
                      plane.d = 0.0;
                      local_78 = (undefined1  [8])&token_1._M_string_length;
                      token_1._M_dataplus._M_p = (pointer)0x0;
                      token_1._M_string_length = token_1._M_string_length & 0xffffffffffffff00;
                      while( true ) {
                        piVar8 = std::operator>>((istream *)&local_348,(string *)local_78);
                        if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0)
                        break;
                        if (*(char *)local_78 == '#') {
                          cVar6 = std::ios::widen((char)*(undefined8 *)(local_348 + -0x18) + cVar5);
                          std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)&local_348,(string *)local_78,cVar6);
                        }
                        else {
                          iVar7 = std::__cxx11::string::compare(local_78);
                          if (iVar7 == 0) break;
                          iVar7 = std::__cxx11::string::compare(local_78);
                          if (iVar7 == 0) {
                            piVar8 = std::istream::_M_extract<float>((float *)&local_348);
                            piVar8 = std::istream::_M_extract<float>((float *)piVar8);
                          }
                          else {
                            iVar7 = std::__cxx11::string::compare(local_78);
                            if (iVar7 == 0) {
                              piVar8 = std::istream::_M_extract<float>((float *)&local_348);
                              piVar8 = std::istream::_M_extract<float>((float *)piVar8);
                            }
                            else {
                              iVar7 = std::__cxx11::string::compare(local_78);
                              piVar8 = (istream *)&local_348;
                              if (iVar7 != 0) {
                                iVar7 = std::__cxx11::string::compare(local_78);
                                if (iVar7 == 0) {
                                  anon_unknown.dwarf_25f6c::operator>>
                                            ((istream *)&local_348,(RGB *)&plane.normal.z);
                                  goto LAB_00107d7a;
                                }
                                iVar7 = std::__cxx11::string::compare(local_78);
                                if (iVar7 != 0) {
                                  piVar9 = (invalid_argument *)
                                           __cxa_allocate_exception(0x10,&plane.d);
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auStack_98,"Unknown token \'",
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_78);
                                  plVar10 = (long *)std::__cxx11::string::append(auStack_98);
                                  token.field_2._8_8_ = *plVar10;
                                  plVar11 = plVar10 + 2;
                                  if ((long *)token.field_2._8_8_ == plVar11) {
                                    local_a8 = *plVar11;
                                    lStack_a0 = plVar10[3];
                                    token.field_2._8_8_ = &stack0xffffffffffffff58;
                                  }
                                  else {
                                    local_a8 = *plVar11;
                                  }
                                  *plVar10 = (long)plVar11;
                                  plVar10[1] = 0;
                                  *(undefined1 *)(plVar10 + 2) = 0;
                                  std::invalid_argument::invalid_argument
                                            (piVar9,(string *)(token.field_2._M_local_buf + 8));
                                  __cxa_throw(piVar9,&std::invalid_argument::typeinfo,
                                              std::invalid_argument::~invalid_argument);
                                }
                              }
                            }
                          }
                          std::istream::_M_extract<float>((float *)piVar8);
                        }
LAB_00107d7a:
                        if (*(int *)((long)aiStack_328 + *(long *)(local_348 + -0x18)) != 0) {
                          piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
                          std::invalid_argument::invalid_argument
                                    (piVar9,"Invalid config file format.");
                          __cxa_throw(piVar9,&std::invalid_argument::typeinfo,
                                      std::invalid_argument::~invalid_argument);
                        }
                      }
                      if (local_78 != (undefined1  [8])&token_1._M_string_length) {
                        operator_delete((void *)local_78,token_1._M_string_length + 1);
                      }
                      __position._M_current =
                           (__return_storage_ptr__->planes).
                           super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (__position._M_current ==
                          (__return_storage_ptr__->planes).
                          super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<Plane,_std::allocator<Plane>_>::_M_realloc_insert<Plane>
                                  (local_e8,__position,(Plane *)((long)&token_1.field_2 + 8));
                      }
                      else {
                        (__position._M_current)->reflectionCoefficient = plane.d;
                        ((__position._M_current)->normal).y = plane.P.z;
                        ((__position._M_current)->normal).z = plane.normal.x;
                        *(undefined8 *)&(__position._M_current)->d = plane.normal._4_8_;
                        ((__position._M_current)->P).x = (float)token_1.field_2._8_4_;
                        ((__position._M_current)->P).y = (float)token_1.field_2._12_4_;
                        *(undefined8 *)&((__position._M_current)->P).z = plane.P._0_8_;
                        ppPVar1 = &(__return_storage_ptr__->planes).
                                   super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                                   super__Vector_impl_data._M_finish;
                        *ppPVar1 = *ppPVar1 + 1;
                      }
                    }
                    goto LAB_00107e4d;
                  }
                  piVar8 = std::istream::_M_extract<float>((float *)&local_348);
                  piVar8 = std::istream::_M_extract<float>((float *)piVar8);
                }
                goto LAB_00107e48;
              }
            }
          }
        }
      }
      std::istream::operator>>((istream *)&local_348,(int *)pRVar13);
    }
LAB_00107e4d:
    if (*(int *)((long)aiStack_328 + *(long *)(local_348 + -0x18)) != 0) {
      piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar9,"Invalid config file format.");
      __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  } while( true );
}

Assistant:

RayTracerConfig RayTracerConfig::fromFile(std::string const& path)
{
  std::ifstream file(path);
  if (!file.is_open())
    throw std::invalid_argument("Unable to open file: " + path);

  RayTracerConfig config;
  std::string token;
  while (file >> token)
  {
    if (token[0] == '#') // comment, skip entire line
      std::getline(file, token);
    else if (token == "aa")
      file >> config.antiAliasing;
    else if (token == "ambient")
      file >> config.ambientCoefficient;
    else if (token == "maxRecursion")
      file >> config.maxRecursionLevel;
    else if (token == "depth")
      file >> config.imageX;
    else if (token == "height")
      file >> config.imageY;
    else if (token == "width")
      file >> config.imageZ;
    else if (token == "observer")
      file >> config.observer.x >> config.observer.y >> config.observer.z;
    else if (token == "light")
      file >> config.light.x >> config.light.y >> config.light.z;
    else if (token == "sphere")
      config.spheres.push_back(parseSphere(file));
    else if (token == "plane")
      config.planes.push_back(parsePlane(file));
    else
      throw std::invalid_argument("Unknown token '" + token + "'");
    if (!file.good())
      throw std::invalid_argument("Invalid config file format.");
  }
  return config;
}